

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::LocalVariableDeclarationSyntax::setChild
          (LocalVariableDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_015b9298 + *(int *)(&DAT_015b9298 + in_RSI * 4)))();
  return;
}

Assistant:

void LocalVariableDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: var = child.token(); return;
        case 2: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}